

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O0

bov_points_t *
bov_points_partial_update
          (bov_points_t *points,GLfloat (*coords) [2],GLint start,GLsizei count,GLsizei newN)

{
  int local_2c;
  GLsizei newN_local;
  GLsizei count_local;
  GLint start_local;
  GLfloat (*coords_local) [2];
  bov_points_t *points_local;
  
  if (coords == (GLfloat (*) [2])0x0) {
    bov_error_log(0x20001,"Cannot do a partial update with a NULL pointer as array of coordinates");
    fprintf(_stderr,"\t(in function %s, line %d)\n","bov_points_partial_update",0x54c);
    points_local = (bov_points_t *)0x0;
  }
  else {
    local_2c = newN;
    if (newN == 0) {
      local_2c = points->vboLen;
    }
    if (local_2c < start + count) {
      local_2c = start + count;
    }
    if (start + count < count) {
      local_2c = 0x7fffffff;
    }
    if (points->vboCapacity < local_2c) {
      bov_error_log(0x20001,
                    "Cannot do a partial update when the new size is bigger than the capacity of the buffer"
                   );
      fprintf(_stderr,"\t(in function %s, line %d)\n","bov_points_partial_update",0x55c);
      points_local = (bov_points_t *)0x0;
    }
    else {
      points->vboLen = local_2c;
      points_local = points;
      if (count != 0) {
        (*glad_glBindBuffer)(0x8892,points->vbo);
        (*glad_glBufferSubData)(0x8892,(long)start,(long)count << 3,coords);
      }
    }
  }
  return points_local;
}

Assistant:

bov_points_t* bov_points_partial_update(bov_points_t* points,
                                        const GLfloat coords[][2],
                                        GLint start,
                                        GLsizei count,
                                        GLsizei newN)
{
	if(coords==NULL) {
		BOV_ERROR_LOG(BOV_PARAMETER_ERROR,
		              "Cannot do a partial update with a NULL "
		              "pointer as array of coordinates");
		return NULL;
	}

	if(newN==0)
		newN = points->vboLen;

	if(start + count > newN)
		newN = start + count;
	if(start + count < count) // detect overflow
		newN = BOV_TILL_END;

	if(newN > points->vboCapacity) {
		BOV_ERROR_LOG(BOV_PARAMETER_ERROR,
		              "Cannot do a partial update when the new "
		              "size is bigger than the capacity of the "
		              "buffer");
		return NULL;
	}

	points->vboLen = newN;

	if(count==0)
		return points;

	glBindBuffer(GL_ARRAY_BUFFER, points->vbo);
	glBufferSubData(GL_ARRAY_BUFFER,
	                start,
	                sizeof(GLfloat) * 2 * count,
	                coords);
	// glBindBuffer(GL_ARRAY_BUFFER, 0);

	return points;
}